

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O1

void Kernel::InferenceStore::Smt2ProofCheckPrinter::outputFunctionName(ostream *out,uint f)

{
  bool bVar1;
  Interpretation itp;
  int iVar2;
  string *name;
  ostream *poVar3;
  undefined8 *puVar4;
  long lVar5;
  char *pcVar6;
  IntegerConstantType i;
  RealConstantType r;
  RationalConstantType local_70;
  __mpz_struct local_50;
  RationalConstantType local_40;
  
  bVar1 = Theory::isInterpretedFunction((Theory *)theory,f);
  if (bVar1) {
    itp = Theory::interpretFunction((Theory *)theory,f);
    outputInterpretationName(out,itp);
    return;
  }
  bVar1 = Theory::isInterpretedConstant((Theory *)theory,f);
  if (bVar1) {
    mpz_init(&local_50);
    RationalConstantType::RationalConstantType(&local_40);
    bVar1 = Theory::tryInterpretConstant((Theory *)theory,f,(IntegerConstantType *)&local_50);
    if (bVar1) {
      IntegerConstantType::IntegerConstantType(&local_70._num,0);
      iVar2 = mpz_cmp(&local_50,(__mpz_struct *)&local_70);
      mpz_clear((__mpz_struct *)&local_70);
      if (iVar2 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>(out,"(- ",3);
        IntegerConstantType::abs(&local_70._num,(int)&local_50);
        poVar3 = Kernel::operator<<(out,&local_70._num);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
        mpz_clear((__mpz_struct *)&local_70);
      }
      else {
        Kernel::operator<<(out,(IntegerConstantType *)&local_50);
      }
    }
    else {
      bVar1 = Theory::tryInterpretConstant((Theory *)theory,f,(RealConstantType *)&local_40);
      if (!bVar1) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x50);
        *puVar4 = &PTR_cry_00b69f40;
        puVar4[1] = puVar4 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar4 + 1),"only reals and integers are allowed in smt2","");
        *puVar4 = &PTR_cry_00b6a028;
        *(undefined4 *)(puVar4 + 5) = 0;
        puVar4[6] = puVar4 + 8;
        puVar4[7] = 0;
        *(undefined1 *)(puVar4 + 8) = 0;
        __cxa_throw(puVar4,&::Lib::UserErrorException::typeinfo,
                    ::Lib::UserErrorException::~UserErrorException);
      }
      RealConstantType::RealConstantType((RealConstantType *)&local_70,0);
      bVar1 = RationalConstantType::operator>(&local_70,&local_40);
      mpz_clear(local_70._den._val);
      mpz_clear((__mpz_struct *)&local_70);
      if (bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>(out,"(-",2);
      }
      IntegerConstantType::IntegerConstantType(&local_70._num,1);
      iVar2 = mpz_cmp(local_40._den._val,(__mpz_struct *)&local_70);
      mpz_clear((__mpz_struct *)&local_70);
      if (iVar2 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(out,"(/ ",3);
        IntegerConstantType::abs(&local_70._num,(int)&local_40);
        poVar3 = Kernel::operator<<(out,&local_70._num);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,".0 ",3);
        poVar3 = Kernel::operator<<(poVar3,&local_40._den);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,".0)",3);
        mpz_clear((__mpz_struct *)&local_70);
      }
      else {
        IntegerConstantType::abs(&local_70._num,(int)&local_40);
        poVar3 = Kernel::operator<<(out,&local_70._num);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,".0",2);
        mpz_clear((__mpz_struct *)&local_70);
      }
      RealConstantType::RealConstantType((RealConstantType *)&local_70,0);
      bVar1 = RationalConstantType::operator>(&local_70,&local_40);
      mpz_clear(local_70._den._val);
      mpz_clear((__mpz_struct *)&local_70);
      if (bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
      }
    }
    mpz_clear(local_40._den._val);
    mpz_clear((__mpz_struct *)&local_40);
    mpz_clear(&local_50);
    return;
  }
  if (DAT_00b7e1b0->_foolConstantsDefined != true) {
LAB_0053eefe:
    name = Signature::functionName_abi_cxx11_(DAT_00b7e1b0,f);
    outputQuoted(out,name);
    return;
  }
  if (DAT_00b7e1b0->_foolTrue == f) {
    pcVar6 = "true";
    lVar5 = 4;
  }
  else {
    if (DAT_00b7e1b0->_foolFalse != f) goto LAB_0053eefe;
    pcVar6 = "false";
    lVar5 = 5;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar6,lVar5);
  return;
}

Assistant:

static void outputFunctionName(std::ostream& out, unsigned f) 
  {
    if (theory->isInterpretedFunction(f)) {
      outputInterpretationName(out, theory->interpretFunction(f));
    } else if (theory->isInterpretedConstant(f)) {
      IntegerConstantType i;
      RealConstantType r;
      if (theory->tryInterpretConstant(f, i)) {
        if (i < IntegerConstantType(0)) {
          out << "(- " << i.abs() << ")";
        } else {
          out << i;
        }

      } else if (theory->tryInterpretConstant(f, r)) {
        if (r < RealConstantType(0)) {
          out << "(-";
        }
        if (r.denominator() != IntegerConstantType(1)) {
          out << r.numerator().abs() << ".0";
        } else {
          out << "(/ " << r.numerator().abs() << ".0 " << r.denominator() << ".0)";
        }
        if (r < RealConstantType(0)) {
          out << ")";
        }

      } else {
        throw UserErrorException("only reals and integers are allowed in smt2");
      }

    } else if (env.signature->isFoolConstantSymbol(true, f)) {
      out << "true";

    } else if (env.signature->isFoolConstantSymbol(false, f)) {
      out << "false";

    } else {
      auto& name = env.signature->functionName(f);
      outputQuoted(out, name);
    }
  }